

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonarray.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,QJsonArray *a)

{
  long lVar1;
  bool bVar2;
  QDebug *this;
  QDebug *other;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QByteArray json;
  QDebugStateSaver saver;
  QDebugStateSaver *in_stack_ffffffffffffff70;
  QDebug *in_stack_ffffffffffffff78;
  QDebug *in_stack_ffffffffffffff80;
  QDebug *in_stack_ffffffffffffff88;
  QDebugStateSaver *in_stack_ffffffffffffff90;
  Stream *json_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  QDebug *t;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  json_00 = in_RDI;
  t = in_RSI;
  QDebugStateSaver::QDebugStateSaver(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  bVar2 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator!
                    ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x487a03);
  if (bVar2) {
    QDebug::operator<<(in_RSI,(char *)t);
    QDebug::QDebug(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else {
    QByteArray::QByteArray((QByteArray *)0x487a7c);
    QExplicitlySharedDataPointer<QCborContainerPrivate>::data
              ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x487a86);
    QJsonPrivate::Writer::arrayToJson
              ((QCborContainerPrivate *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),(QByteArray *)json_00,
               (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
    QDebug::nospace(in_RSI);
    this = QDebug::operator<<(in_RSI,(char *)t);
    QByteArray::constData((QByteArray *)0x487acf);
    other = QDebug::operator<<(in_RSI,(char *)t);
    QDebug::operator<<(in_RSI,(char *)t);
    QDebug::QDebug(this,other);
    QByteArray::~QByteArray((QByteArray *)0x487b17);
  }
  QDebugStateSaver::~QDebugStateSaver(in_stack_ffffffffffffff70);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)json_00;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QJsonArray &a)
{
    QDebugStateSaver saver(dbg);
    if (!a.a) {
        dbg << "QJsonArray()";
        return dbg;
    }
    QByteArray json;
    QJsonPrivate::Writer::arrayToJson(a.a.data(), json, 0, true);
    dbg.nospace() << "QJsonArray("
                  << json.constData() // print as utf-8 string without extra quotation marks
                  << ")";
    return dbg;
}